

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

size_t utf8_char_length(utf8_char_t *c)

{
  utf8_char_t *c_local;
  size_t local_8;
  
  if ((c == (utf8_char_t *)0x0) || (*c == '\0')) {
    local_8 = 0;
  }
  else {
    local_8 = utf8_char_length::_utf8_char_length[(int)((int)*c >> 3 & 0x1f)];
  }
  return local_8;
}

Assistant:

size_t utf8_char_length(const utf8_char_t* c)
{
    // count null term as zero size
    if (!c || 0x00 == c[0]) {
        return 0;
    }

    static const size_t _utf8_char_length[] = {
        1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0, 2, 2, 2, 2, 3, 3, 4, 0
    };

    return _utf8_char_length[(c[0] >> 3) & 0x1F];
}